

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastInlineIsArray(Lowerer *this,Instr *instr)

{
  Opnd *dst;
  Instr *argoutInlineSpecialized;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint32 offset;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  LabelInstr *target;
  LabelInstr *target_00;
  RegOpnd *pRVar7;
  LabelInstr *target_01;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar8;
  IntConstOpnd *pIVar9;
  Opnd *pOVar10;
  Lowerer *pLVar11;
  undefined1 local_a8 [8];
  AutoReuseOpnd autoReuseTypeOpnd;
  AutoReuseOpnd autoReuseTypeIdOpnd;
  Opnd *argsOpnd [2];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LabelInstr *pLStack_38;
  ValueType valueType;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4eb2,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_0054cbc7;
    *puVar4 = 0;
  }
  dst = instr->m_dst;
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4eb5,"(dst)","dst");
    if (!bVar3) goto LAB_0054cbc7;
    *puVar4 = 0;
  }
  pSVar5 = IR::Opnd::AsSymOpnd(instr->m_src2);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  argoutInlineSpecialized = (pSVar6->field_5).m_instrDef;
  autoReuseTypeIdOpnd.autoDelete = false;
  autoReuseTypeIdOpnd.wasInUse = false;
  autoReuseTypeIdOpnd._18_6_ = 0;
  bVar3 = IR::Instr::FetchOperands(instr,(Opnd **)&autoReuseTypeIdOpnd.autoDelete,2);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4ebe,"(result)","result");
    if (!bVar3) goto LAB_0054cbc7;
    *puVar4 = 0;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x4ebf,"(argsOpnd[1])","argsOpnd[1]");
  if (bVar3) {
    *puVar4 = 0;
    target = InsertLabel(true,instr);
    pLVar11 = (Lowerer *)0x0;
    target_00 = InsertLabel(false,instr->m_next);
    local_3a = aRam0000000000000008;
    pRVar7 = GetRegOpnd(pLVar11,(Opnd *)0x0,&target->super_Instr,this->m_func,IRam000000000000000a);
    pFVar1 = this->m_func;
    bVar3 = ValueType::IsLikelyArray((ValueType *)&local_3a.field_0);
    target_01 = IR::LabelInstr::New(Label,pFVar1,bVar3);
    pFVar1 = this->m_func;
    bVar3 = ValueType::IsLikelyArray((ValueType *)&local_3a.field_0);
    pLStack_38 = IR::LabelInstr::New(Label,pFVar1,bVar3);
    bVar3 = IR::Opnd::IsNotTaggedValue(&pRVar7->super_Opnd);
    if (!bVar3) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar7->super_Opnd,&target->super_Instr,pLStack_38,false);
    }
    baseOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)local_a8,&baseOpnd->super_Opnd,this->m_func,true);
    pIVar8 = IR::IndirOpnd::New(pRVar7,8,TyUint64,this->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar8->super_Opnd,&target->super_Instr,true);
    pRVar7 = IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&autoReuseTypeOpnd.autoDelete,&pRVar7->super_Opnd,this->m_func,true)
    ;
    offset = Js::Type::GetOffsetOfTypeId();
    pIVar8 = IR::IndirOpnd::New(baseOpnd,offset,TyInt32,this->m_func,false);
    InsertMove(&pRVar7->super_Opnd,&pIVar8->super_Opnd,&target->super_Instr,true);
    pLVar11 = (Lowerer *)0x1d;
    pIVar9 = IR::IntConstOpnd::New(0x1d,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar11,&pRVar7->super_Opnd,&pIVar9->super_Opnd,BrLt_A,target_01,
                        &target->super_Instr,false);
    pLVar11 = (Lowerer *)0x21;
    pIVar9 = IR::IntConstOpnd::New(0x21,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar11,&pRVar7->super_Opnd,&pIVar9->super_Opnd,BrGt_A,pLStack_38,
                        &target->super_Instr,false);
    pOVar10 = LoadLibraryValueOpnd(this,instr,ValueTrue);
    InsertMove(dst,pOVar10,&target->super_Instr,true);
    InsertBranch(Br,target_00,&target->super_Instr);
    IR::Instr::InsertBefore(&target->super_Instr,&target_01->super_Instr);
    pLVar11 = (Lowerer *)0x1a;
    pIVar9 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar11,&pRVar7->super_Opnd,&pIVar9->super_Opnd,BrEq_A,target,
                        &target->super_Instr,false);
    pLVar11 = (Lowerer *)0x17;
    pIVar9 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar11,&pRVar7->super_Opnd,&pIVar9->super_Opnd,BrEq_A,target,
                        &target->super_Instr,false);
    IR::Instr::InsertBefore(&target->super_Instr,&pLStack_38->super_Instr);
    pOVar10 = LoadLibraryValueOpnd(this,instr,ValueFalse);
    InsertMove(dst,pOVar10,&target->super_Instr,true);
    pLVar11 = (Lowerer *)0x9;
    InsertBranch(Br,target_00,&target->super_Instr);
    RelocateCallDirectToHelperPath(pLVar11,argoutInlineSpecialized,target);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseTypeOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
    return;
  }
LAB_0054cbc7:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
Lowerer::GenerateFastInlineIsArray(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    IR::Opnd * dst = instr->GetDst();
    Assert(dst);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = { 0 };
    bool result = instr->FetchOperands(argsOpnd, 2);
    Assert(result);
    AnalysisAssert(argsOpnd[1]);

    IR::LabelInstr *helperLabel = InsertLabel(true, instr);
    IR::Instr * insertInstr = helperLabel;
    IR::LabelInstr *doneLabel = InsertLabel(false, instr->m_next);

    ValueType valueType = argsOpnd[1]->GetValueType();
    IR::RegOpnd * src = GetRegOpnd(argsOpnd[1], insertInstr, m_func, argsOpnd[1]->GetType());

    IR::LabelInstr *checkNotArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, valueType.IsLikelyArray());
    IR::LabelInstr *notArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, valueType.IsLikelyArray());

    if (!src->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(src, insertInstr, notArrayLabel);
    }

    //  MOV typeOpnd, [opnd + offset(type)]
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    const IR::AutoReuseOpnd autoReuseTypeOpnd(typeOpnd, m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func);
    InsertMove(typeOpnd, indirOpnd, insertInstr);

    //  MOV typeIdOpnd, [typeOpnd + offset(typeId)]
    IR::RegOpnd *typeIdOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    const IR::AutoReuseOpnd autoReuseTypeIdOpnd(typeIdOpnd, m_func);
    indirOpnd = IR::IndirOpnd::New(typeOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func);
    InsertMove(typeIdOpnd, indirOpnd, insertInstr);

    //  CMP typeIdOpnd, TypeIds_ArrayFirst
    //  JLT $notArray
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_ArrayFirst, TyInt32, m_func),
        Js::OpCode::BrLt_A,
        checkNotArrayLabel,
        insertInstr);
    //  CMP typeIdOpnd, TypeIds_ArrayLastWithES5
    //  JGT $notArray
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_ArrayLastWithES5, TyInt32, m_func),
        Js::OpCode::BrGt_A,
        notArrayLabel,
        insertInstr);

    // MOV dst, True
    InsertMove(dst, LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);

    // JMP $done
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    // $checkNotArray:
    insertInstr->InsertBefore(checkNotArrayLabel);

    //  CMP typeIdOpnd, TypeIds_Proxy
    //  JEQ $helperLabel
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertInstr);
    CompileAssert(Js::TypeIds_Proxy < Js::TypeIds_ArrayFirst);

    //  CMP typeIdOpnd, TypeIds_HostDispatch
    //  JEQ $helperLabel
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertInstr);
    CompileAssert(Js::TypeIds_HostDispatch < Js::TypeIds_ArrayFirst);

    // $notObjectLabel:
    insertInstr->InsertBefore(notArrayLabel);

    // MOV dst, False
    InsertMove(dst, LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), insertInstr);

    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    RelocateCallDirectToHelperPath(tmpInstr, helperLabel);
}